

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O1

bool ImGui::InvisibleButton(char *str_id,ImVec2 *size_arg,ImGuiButtonFlags flags)

{
  ImGuiWindow *this;
  bool bVar1;
  bool bVar2;
  ImGuiID id;
  bool held;
  bool hovered;
  ImRect bb;
  ImVec2 size;
  bool local_42;
  bool local_41;
  ImRect local_40;
  ImVec2 local_30;
  
  this = GImGui->CurrentWindow;
  this->WriteAccessed = true;
  if (this->SkipItems == false) {
    bVar2 = false;
    id = ImGuiWindow::GetID(this,str_id,(char *)0x0);
    local_30 = CalcItemSize(*size_arg,0.0,0.0);
    local_40.Min.x = (this->DC).CursorPos.x;
    local_40.Min.y = (this->DC).CursorPos.y;
    local_40.Max.x = local_30.x + local_40.Min.x;
    local_40.Max.y = local_30.y + local_40.Min.y;
    ItemSize(&local_30,-1.0);
    bVar1 = ItemAdd(&local_40,id,(ImRect *)0x0,0);
    if (bVar1) {
      bVar2 = ButtonBehavior(&local_40,id,&local_41,&local_42,flags);
    }
  }
  else {
    bVar2 = false;
  }
  return bVar2;
}

Assistant:

bool ImGui::DragFloatRange2(const char* label, float* v_current_min, float* v_current_max, float v_speed, float v_min, float v_max, const char* format, const char* format_max, ImGuiSliderFlags flags)
{
    ImGuiWindow* window = GetCurrentWindow();
    if (window->SkipItems)
        return false;

    ImGuiContext& g = *GImGui;
    PushID(label);
    BeginGroup();
    PushMultiItemsWidths(2, CalcItemWidth());

    float min_min = (v_min >= v_max) ? -FLT_MAX : v_min;
    float min_max = (v_min >= v_max) ? *v_current_max : ImMin(v_max, *v_current_max);
    ImGuiSliderFlags min_flags = flags | ((min_min == min_max) ? ImGuiSliderFlags_ReadOnly : 0);
    bool value_changed = DragScalar("##min", ImGuiDataType_Float, v_current_min, v_speed, &min_min, &min_max, format, min_flags);
    PopItemWidth();
    SameLine(0, g.Style.ItemInnerSpacing.x);

    float max_min = (v_min >= v_max) ? *v_current_min : ImMax(v_min, *v_current_min);
    float max_max = (v_min >= v_max) ? FLT_MAX : v_max;
    ImGuiSliderFlags max_flags = flags | ((max_min == max_max) ? ImGuiSliderFlags_ReadOnly : 0);
    value_changed |= DragScalar("##max", ImGuiDataType_Float, v_current_max, v_speed, &max_min, &max_max, format_max ? format_max : format, max_flags);
    PopItemWidth();
    SameLine(0, g.Style.ItemInnerSpacing.x);

    TextEx(label, FindRenderedTextEnd(label));
    EndGroup();
    PopID();

    return value_changed;
}